

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitPrefixUnaryExpression
          (SyntaxDumper *this,PrefixUnaryExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  traverseExpression(this,(ExpressionSyntax *)node);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->oprtrTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  return Skip;
}

Assistant:

virtual Action visitPrefixUnaryExpression(const PrefixUnaryExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->operatorToken(), node);
        nonterminal(node->expression());
        return Action::Skip;
    }